

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::SocketWriter::Send(SocketWriter *this,string *message)

{
  size_t sVar1;
  ostream *poVar2;
  int __fd;
  size_t __n;
  GTestLog local_20;
  GTestLog local_1c;
  
  __fd = this->sockfd_;
  if (__fd == -1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googletest/src/gtest-internal-inl.h"
                       ,0x42d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition sockfd_ != -1 failed. ",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Send() can be called only when there is a connection.",0x35);
    GTestLog::~GTestLog(&local_1c);
    __fd = this->sockfd_;
  }
  __n = (size_t)(int)message->_M_string_length;
  sVar1 = write(__fd,(message->_M_dataplus)._M_p,__n);
  if (sVar1 != __n) {
    GTestLog::GTestLog(&local_20,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googletest/src/gtest-internal-inl.h"
                       ,0x432);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"stream_result_to: failed to stream to ",0x26);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->host_name_)._M_dataplus._M_p,
                        (this->host_name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(this->port_num_)._M_dataplus._M_p,(this->port_num_)._M_string_length);
    GTestLog::~GTestLog(&local_20);
  }
  return;
}

Assistant:

virtual void Send(const string& message) {
      GTEST_CHECK_(sockfd_ != -1)
          << "Send() can be called only when there is a connection.";

      const int len = static_cast<int>(message.length());
      if (write(sockfd_, message.c_str(), len) != len) {
        GTEST_LOG_(WARNING)
            << "stream_result_to: failed to stream to "
            << host_name_ << ":" << port_num_;
      }
    }